

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O2

int main(int argc,char **argv)

{
  char **ppcVar1;
  int iVar2;
  __uid_t _Var3;
  __uid_t __uid;
  econf_err error;
  __pid_t _Var4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  passwd *ppVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  int *piVar14;
  undefined8 uVar15;
  undefined1 show;
  char *pcVar16;
  size_t i;
  econf_file *peVar17;
  char *pcVar18;
  FILE *pFVar19;
  byte bVar20;
  char **ppcVar21;
  ushort local_a4;
  undefined1 local_a2;
  econf_file *key_file_edit;
  char *home_dir;
  undefined4 local_90;
  uint local_8c;
  char *local_88;
  char **local_80;
  econf_file **key_files;
  undefined6 uStack_70;
  undefined2 uStack_6a;
  undefined6 uStack_68;
  char *local_58;
  char **groupsEdit;
  size_t groupEditCount;
  int index;
  size_t groupCount;
  
  home_dir = (char *)0x0;
  index = 0;
  local_80 = argv;
  root_dir = strdup("/etc");
  usr_root_dir = strdup("/usr/etc");
  conf_dir = strdup("");
  conf_basename = strdup("");
  local_58 = "=";
  local_88 = "#";
  local_90 = 0x104001;
  local_8c = 0x104001;
  ppcVar21 = local_80;
LAB_001024fc:
  while (iVar2 = getopt_long(argc,ppcVar21,"hfyuc:d:",main::longopts,&index), pcVar16 = local_58,
        ppcVar1 = local_80, iVar2 == 0x79) {
    non_interactive = 1;
  }
  ppcVar21 = local_80;
  switch(iVar2) {
  case 99:
    local_88 = _optarg;
    goto LAB_001024fc;
  case 100:
    local_58 = _optarg;
    goto LAB_001024fc;
  case 0x65:
  case 0x67:
switchD_00102536_caseD_65:
    pcVar18 = "Try \'%s --help\' for more information.\n";
    pcVar16 = "econftool";
    pFVar19 = _stderr;
LAB_0010328c:
    fprintf(pFVar19,pcVar18,pcVar16);
LAB_00103293:
    exit(1);
  case 0x66:
    free(conf_dir);
    iVar2 = asprintf(&conf_dir,"%s","/etc");
    if (iVar2 < 0) goto LAB_0010329b;
    change_root_dir(&conf_dir);
    local_8c = 0;
    ppcVar21 = local_80;
    goto LAB_001024fc;
  case 0x68:
    usage();
    return 0;
  }
  if (iVar2 != -1) {
    if (iVar2 != 0x75) goto switchD_00102536_caseD_65;
    local_90 = 0;
    goto LAB_001024fc;
  }
  if (argc < 2) {
LAB_001025cf:
    usage();
    return 1;
  }
  if ((argc == 2) || (argc - _optind < 2)) {
    fwrite("Invalid number of Arguments\n\n",0x1d,1,_stderr);
    goto LAB_001025cf;
  }
  iVar2 = strcmp(local_58,"spaces");
  if (iVar2 == 0) {
    pcVar16 = " \t\f\n\r\v";
  }
  else {
    pcVar16 = replace_str(pcVar16,"\\t","\t");
    pcVar16 = replace_str(pcVar16,"\\f","\f");
    pcVar16 = replace_str(pcVar16,"\\n","\n");
    pcVar16 = replace_str(pcVar16,"\\r","\r");
    pcVar16 = replace_str(pcVar16,"\\v","\v");
  }
  _Var3 = getuid();
  pcVar18 = ppcVar1[(long)_optind + 1];
  if (*pcVar18 != '/') {
    local_58 = (char *)CONCAT44(local_58._4_4_,_Var3);
    pcVar7 = strrchr(pcVar18,0x2e);
    conf_suffix = pcVar7;
    if (pcVar7 != (char *)0x0) {
      free(conf_basename);
      pcVar18 = local_80[(long)_optind + 1];
      sVar8 = strlen(pcVar18);
      sVar9 = strlen(pcVar7);
      conf_basename = strndup(pcVar18,sVar8 - sVar9);
      _Var3 = (__uid_t)local_58;
      if (conf_basename == (char *)0x0) goto LAB_00102afb;
      goto LAB_00102714;
    }
    pcVar16 = "Currently only works with a dot in the filename and a suffix!\n\n";
    sVar8 = 0x3f;
LAB_001032e1:
    fwrite(pcVar16,sVar8,1,_stderr);
    usage();
    goto LAB_00103293;
  }
LAB_00102714:
  pcVar18 = strdup(pcVar18);
  conf_filename = pcVar18;
  if (pcVar18 != (char *)0x0) {
    if ((local_8c & 1) != 0) {
      free(conf_dir);
      iVar2 = asprintf(&conf_dir,"/etc/%s.d",pcVar18);
      if (iVar2 < 0) goto LAB_0010329b;
      change_root_dir(&conf_dir);
    }
    show = SUB81(conf_filename,0);
    free(conf_path);
    iVar2 = asprintf(&conf_path,"%s/%s",conf_dir);
    if (iVar2 < 0) goto LAB_00102afb;
    pcVar18 = getenv("ECONFTOOL_ROOT");
    if (pcVar18 == (char *)0x0) {
      pcVar18 = getenv("HOME");
      ppcVar21 = local_80;
      if (pcVar18 == (char *)0x0) {
        __uid = getuid();
        ppVar10 = getpwuid(__uid);
        if (ppVar10 == (passwd *)0x0) goto LAB_00102836;
        free(home_dir);
        pcVar18 = ppVar10->pw_dir;
      }
      else {
        free(home_dir);
        pcVar18 = getenv("HOME");
      }
      home_dir = strdup(pcVar18);
      if (home_dir == (char *)0x0) goto LAB_00102afb;
    }
    else {
      change_root_dir(&home_dir);
      ppcVar21 = local_80;
    }
LAB_00102836:
    pcVar18 = getenv("XDG_CONFIG_HOME");
    if (pcVar18 == (char *)0x0) {
      iVar2 = asprintf(&xdg_config_dir,"%s/.config",home_dir);
      if (-1 < iVar2) goto LAB_00102882;
    }
    else {
      xdg_config_dir = strdup(pcVar18);
      if (xdg_config_dir != (char *)0x0) {
LAB_00102882:
        free(home_dir);
        change_root_dir(&root_dir);
        change_root_dir(&usr_root_dir);
        pcVar18 = ppcVar21[_optind];
        iVar2 = strcmp(pcVar18,"show");
        if (iVar2 == 0) {
          pcVar18 = (char *)0x1;
        }
        else {
          iVar2 = strcmp(pcVar18,"syntax");
          if (iVar2 != 0) {
            iVar2 = strcmp(pcVar18,"edit");
            pcVar7 = local_88;
            if (iVar2 != 0) {
              iVar2 = strcmp(pcVar18,"revert");
              if (iVar2 == 0) {
                key_files = (econf_file **)((ulong)key_files & 0xffffffffff000000);
                free(conf_path);
                bVar20 = (byte)local_90 & _Var3 == 0;
                if (bVar20 == 0) {
                  iVar2 = asprintf(&conf_path,"%s/%s",xdg_config_dir,conf_filename);
                }
                else {
                  iVar2 = asprintf(&conf_path,"/etc/%s",conf_filename);
                }
                if (iVar2 < 0) {
                  pcVar16 = "Out of memory!\n";
                  sVar8 = 0xf;
LAB_001031d9:
                  fwrite(pcVar16,sVar8,1,_stderr);
                }
                else {
                  iVar5 = 0;
                  iVar2 = access(conf_path,0);
                  if ((iVar2 != -1) || ((iVar2 = access(conf_dir,0), _Var3 == 0 && (iVar2 != -1))))
                  {
                    iVar2 = access(conf_path,0);
                    if (iVar2 == 0) goto LAB_00102e6e;
                    goto LAB_00102f04;
                  }
                  pcVar18 = "Could not find %s or a snippet directory\n";
                  pcVar16 = conf_path;
                  pFVar19 = _stderr;
LAB_001030e3:
                  fprintf(pFVar19,pcVar18,pcVar16);
                }
              }
              else {
                iVar2 = strcmp(pcVar18,"cat");
                if (iVar2 != 0) {
                  pcVar16 = "Unknown command!\n\n";
                  sVar8 = 0x12;
                  goto LAB_001032e1;
                }
                key_file_edit = (econf_file *)0x0;
                if (*conf_filename == '/') {
                  pcVar16 = 
                  "The cat command does not makes sense for parsing a single file. Please use the show command instead.\n"
                  ;
                  sVar8 = 0x65;
                  goto LAB_001031d9;
                }
                error = econf_readDirsHistory
                                  (&key_files,&key_file_edit,usr_root_dir,root_dir,conf_basename,
                                   conf_suffix,pcVar16,local_88);
                if (error == ECONF_SUCCESS) {
                  pr_header();
                  for (peVar17 = (econf_file *)0x0; peVar17 < key_file_edit; peVar17 = peVar17 + 1)
                  {
                    pr_key_file(key_files[(long)peVar17]);
                    econf_freeFile(key_files[(long)peVar17]);
                  }
                  free(key_files);
                  iVar2 = 0;
                  goto LAB_00103205;
                }
                print_error(error);
              }
LAB_00103202:
              iVar2 = -1;
              goto LAB_00103205;
            }
            if ((~(byte)local_90 & 1) == 0 && _Var3 == 0) {
              if ((local_8c & 1) != 0) {
                free(conf_filename);
                pcVar18 = strdup("90_econftool.conf");
                conf_filename = pcVar18;
                if (pcVar18 != (char *)0x0) {
                  free(conf_path);
                  goto LAB_00102aca;
                }
                goto LAB_0010329b;
              }
LAB_00102ad5:
              key_file_edit = (econf_file *)0x0;
              if (*conf_filename == '/') {
                iVar2 = econf_readFile(&main::key_file,conf_filename,pcVar16,pcVar7);
              }
              else {
                main::key_file = init_key_file();
                iVar2 = econf_readConfig(&main::key_file,0,0,conf_basename,conf_suffix,pcVar16,
                                         pcVar7);
              }
              if ((iVar2 != 0) &&
                 ((iVar2 != 3 || (iVar2 = econf_newIniFile(&main::key_file), iVar2 != 0)))) {
                pFVar19 = _stderr;
                pcVar16 = (char *)econf_errString(iVar2);
                pcVar18 = "%s\n";
                goto LAB_001030e3;
              }
              pcVar11 = getenv("TMPDIR");
              pcVar18 = "/tmp";
              if (pcVar11 != (char *)0x0) {
                pcVar18 = pcVar11;
              }
              key_files = (econf_file **)0x6f63652f706d742f;
              uStack_70 = 0x6c6f6f74666e;
              uStack_6a = 0x582d;
              uStack_68 = 0x5858585858;
              iVar2 = mkstemp((char *)&key_files);
              if (iVar2 == -1) {
                pcVar16 = "mkstemp() failed";
LAB_0010316f:
                perror(pcVar16);
LAB_00103174:
                peVar17 = (econf_file *)0x0;
              }
              else {
                pcVar11 = strdup((char *)&key_files);
                if (pcVar11 == (char *)0x0) {
                  pcVar16 = "out of memory!";
                  goto LAB_0010316f;
                }
                pcVar11 = strdup(pcVar11);
                if (pcVar11 == (char *)0x0) {
LAB_0010308c:
                  fwrite("Out of memory!\n",0xf,1,_stderr);
                  goto LAB_00103174;
                }
                pcVar12 = strrchr(pcVar11,0x2f);
                pcVar12 = strdup(pcVar12 + 1);
                if (pcVar12 == (char *)0x0) goto LAB_0010308c;
                pcVar13 = getenv("EDITOR");
                _Var4 = fork();
                if (_Var4 == 0) {
                  iVar2 = econf_writeFile(main::key_file,pcVar18,pcVar12);
                  pFVar19 = _stderr;
                  if (iVar2 != 0) {
                    pcVar16 = (char *)econf_errString(iVar2);
                    pcVar18 = "%s\n";
                    goto LAB_0010328c;
                  }
                  pcVar16 = "vi";
                  if (pcVar13 != (char *)0x0) {
                    pcVar16 = pcVar13;
                  }
                  execlp(pcVar16,pcVar16,pcVar11,0);
                  pFVar19 = _stderr;
                  piVar14 = __errno_location();
                  pcVar18 = strerror(*piVar14);
                  fprintf(pFVar19,"Couldn\'t execute %s: %s\n",pcVar16,pcVar18);
                  goto LAB_00103293;
                }
                if (_Var4 == -1) {
                  perror("fork() failed");
                  goto LAB_00103293;
                }
                _Var4 = waitpid(_Var4,(int *)&groupsEdit,0);
                if ((_Var4 == -1) && (piVar14 = __errno_location(), *piVar14 != 4)) {
                  perror("waitpid");
                }
                else if (((ulong)groupsEdit & 0x7f) == 0) {
                  iVar2 = econf_readFile(&key_file_edit,pcVar11,pcVar16,pcVar7);
                  pFVar19 = _stderr;
                  if (iVar2 == 0) {
                    remove(pcVar11);
                    key_files = (econf_file **)0x0;
                    groupsEdit = (char **)0x0;
                    groupCount = 0;
                    groupEditCount = 0;
                    iVar5 = econf_getGroups(main::key_file);
                    if ((iVar5 != 0) ||
                       (iVar5 = econf_getGroups(key_file_edit,&groupEditCount,&groupsEdit),
                       iVar5 != 0)) goto LAB_0010305f;
                    iVar2 = access(conf_dir,0);
                    if ((iVar2 == -1) &&
                       ((piVar14 = __errno_location(), *piVar14 == 2 &&
                        (iVar2 = mkdir(conf_dir,0x1ed), iVar2 != 0)))) {
                      perror("mkdir() failed");
                      goto LAB_00103084;
                    }
                    iVar2 = access(conf_path,0);
                    if ((iVar2 != 0) || (non_interactive != 0)) goto LAB_00102d35;
                    local_a2 = 0;
                    local_a4 = 0;
                    goto LAB_00102fe1;
                  }
                  uVar15 = econf_errString(iVar2);
                  fprintf(pFVar19,"%s\n",uVar15);
                }
                else {
                  fprintf(_stderr,"Exited, status: %d\n",(ulong)((uint)groupsEdit >> 8 & 0xff));
                }
                remove(pcVar11);
                peVar17 = key_file_edit;
              }
              econf_freeFile(peVar17);
              goto LAB_00103202;
            }
            free(conf_dir);
            conf_dir = strdup(xdg_config_dir);
            pcVar7 = local_88;
            if (conf_dir != (char *)0x0) {
              change_root_dir(&conf_dir);
              free(conf_path);
              pcVar18 = conf_filename;
LAB_00102aca:
              iVar2 = asprintf(&conf_path,"%s/%s",conf_dir,pcVar18);
              if (iVar2 < 0) {
LAB_00102afb:
                fwrite("Out of memory!\n",0xf,1,_stderr);
                return 1;
              }
              goto LAB_00102ad5;
            }
            goto LAB_0010329b;
          }
          pcVar18 = (char *)0x0;
        }
        iVar2 = econf_read((econf_file **)pcVar16,local_88,pcVar18,(_Bool)show);
        goto LAB_00103205;
      }
    }
  }
LAB_0010329b:
  fwrite("Out of memory!\n",0xf,1,_stderr);
  goto LAB_00103293;
LAB_00102e6e:
  if ((short)key_files != 0x79) {
    if (((short)key_files == 0x6e) || ((non_interactive & 1) != 0)) {
      iVar5 = 0;
      if ((non_interactive & 1) == 0) goto LAB_00102f04;
      goto LAB_00102ed4;
    }
    fprintf(_stdout,"Delete file %s?\nYes [y], no [n]\n",conf_path);
    iVar2 = __isoc99_scanf("%2s");
    if (iVar2 != 1) {
      fwrite("Didn\'t read correctly\n",0x16,1,_stderr);
    }
    goto LAB_00102e6e;
  }
LAB_00102ed4:
  iVar5 = remove(conf_path);
  if (iVar5 == 0) {
    iVar5 = 0;
    fprintf(_stdout,"File %s deleted!\n",conf_path);
  }
  else {
    perror("remove() failed");
  }
LAB_00102f04:
  iVar2 = 0;
  if (bVar20 != 0) {
    key_files = (econf_file **)((ulong)key_files & 0xffffffffffffff00);
    iVar6 = access(conf_dir,0);
    iVar2 = iVar5;
    if (iVar6 == 0) {
      while (pcVar16 = conf_dir, (short)key_files != 0x79) {
        if (((short)key_files == 0x6e) || ((non_interactive & 1) != 0)) {
          if ((non_interactive & 1) == 0) goto LAB_00103205;
          break;
        }
        fprintf(_stdout,"Delete directory %s?\nYes [y], no [n]\n",conf_dir);
        iVar5 = __isoc99_scanf("%2s",&key_files);
        if (iVar5 != 2) {
          fwrite("Didn\'t read correctly\n",0x16,1,_stderr);
        }
      }
      iVar2 = getdtablesize();
      iVar2 = nftw(pcVar16,nftw_remove,iVar2 + -10,9);
      if (iVar2 == 0) {
        fprintf(_stdout,"Directory %s deleted!\n",conf_dir);
        iVar2 = 0;
      }
      else {
        perror("nftw() failed");
      }
    }
  }
  goto LAB_00103205;
LAB_00102d35:
  iVar2 = 0;
  printf("Writing file %s to %s\n",conf_filename,conf_dir);
  iVar5 = econf_writeFile(key_file_edit,conf_dir,conf_filename);
  if (iVar5 != 0) {
LAB_0010305f:
    pFVar19 = _stderr;
    uVar15 = econf_errString(iVar5);
    fprintf(pFVar19,"%s\n",uVar15);
LAB_00103084:
    iVar2 = -1;
  }
  goto LAB_00102d5c;
  while (local_a4 != 0x6e) {
LAB_00102fe1:
    fprintf(_stdout,"The file %s/%s already exists!\n",conf_dir,conf_filename);
    fwrite("Do you really want to overwrite it?\nYes [y], no [n]\n",0x34,1,_stdout);
    iVar2 = __isoc99_scanf("%2s",&local_a4);
    if (iVar2 != 1) {
      fwrite("Didn\'t read correctly\n",0x16,1,_stderr);
      local_a4 = local_a4 & 0xff00;
    }
    if (local_a4 == 0x79) goto LAB_00102d35;
  }
  iVar2 = 0;
LAB_00102d5c:
  econf_freeFile(key_file_edit);
  econf_freeArray(groupsEdit);
  econf_freeArray(key_files);
LAB_00103205:
  econf_freeFile(main::key_file);
  return iVar2;
}

Assistant:

int main (int argc, char *argv[])
{
    static const char *dropin_filename = "90_econftool.conf";
    static econf_file *key_file = NULL;
    char *home_dir = NULL; /* the path of the home directory */
    bool is_dropin_file = true;
    bool is_root = false;
    bool use_homedir = false;
    char *comment = "#";
    char *delimiters = "=";

    /* parse command line arguments. See getopt_long(3) */
    int opt, nonopts;

    int index = 0;
    static struct option longopts[] = {
    /*   name,     arguments,      flag, value */
        {"full",        no_argument,       0, 'f'},
        {"help",        no_argument,       0, 'h'},
        {"yes",         no_argument,       0, 'y'},
        {"use-home",    no_argument,       0, 'u'},
	{"comment",     required_argument, 0, 'c'},
	{"delimiters",  required_argument, 0, 'd'},
        {0,             0,                 0,  0 }
    };

    root_dir = strdup("/etc");
    usr_root_dir = strdup("/usr/etc");
    conf_dir = strdup("");
    conf_basename = strdup("");

    while ((opt = getopt_long(argc, argv, "hfyuc:d:", longopts, &index)) != -1) {
        switch(opt) {
        case 'f':
            /* overwrite path */
	    free(conf_dir);
            if (asprintf(&conf_dir, "%s", "/etc") < 0) {
		fprintf(stderr, "Out of memory!\n");
		exit(EXIT_FAILURE);
	    }
            change_root_dir(&conf_dir);
            is_dropin_file = false;
            break;
        case 'h':
            usage();
            return EXIT_SUCCESS;
        case 'y':
            non_interactive = true;
            break;
        case 'u':
            use_homedir = true;
            break;
	case 'c':
	    comment = optarg;
	    break;
	case 'd':
	    delimiters = optarg;
	    break;
        case '?':
        default:
            fprintf(stderr, "Try '%s --help' for more information.\n", utilname);
            exit(EXIT_FAILURE);
            break;
        }
    }
    nonopts = argc - optind;

    /* only do something if we have an input */
    if (argc < 2) {
        usage();
        return EXIT_FAILURE;
    } else if (argc < 3 || nonopts < 2) {
        fprintf(stderr, "Invalid number of Arguments\n\n");
        usage();
        return EXIT_FAILURE;
    }

    /* translating delimiters */
    if ( strcmp(delimiters, "spaces") == 0 ) {
      delimiters = " \t\f\n\r\v";
    } else {
      delimiters = replace_str(delimiters, "\\t", "\t");
      delimiters = replace_str(delimiters, "\\f", "\f");
      delimiters = replace_str(delimiters, "\\n", "\n");
      delimiters = replace_str(delimiters, "\\r", "\r");
      delimiters = replace_str(delimiters, "\\v", "\v");
    }

    /**** initialization ****/
    /* basic write permission check */
    is_root = getuid() == 0;

    if ( argv[optind + 1][0] != '/') {
	/* it is not a single file only */

        /* get the position of the last dot in the filename to extract
         * the suffix from it.
         */
        conf_suffix = strrchr(argv[optind + 1], '.');
        if (conf_suffix == NULL) {
            fprintf(stderr, "Currently only works with a dot in the filename and a suffix!\n\n");
	    usage();
	    exit(1);
	} else {
            /* set filename to the proper argv argument */
            free(conf_basename);
	    conf_basename = strndup(argv[optind + 1], strlen(argv[optind + 1]) - strlen(conf_suffix));
	    if (conf_basename == NULL) {
	        fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
	}
    }

    conf_filename = strdup(argv[optind + 1]);
    if (conf_filename == NULL) {
	fprintf(stderr, "Out of memory!\n");
	exit(EXIT_FAILURE);
    }

    if (is_dropin_file) {
        free(conf_dir);
        if (asprintf(&conf_dir, "/etc/%s.d", conf_filename) < 0) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
        }
        change_root_dir(&conf_dir);
    }

    free(conf_path);
    if (asprintf(&conf_path, "%s/%s", conf_dir, conf_filename) < 0) {
	fprintf(stderr, "Out of memory!\n");
	return EXIT_FAILURE;
    }

    if (getenv("ECONFTOOL_ROOT") == NULL)
        if (getenv("HOME") != NULL) {
	    free(home_dir);
	    home_dir = strdup(getenv("HOME"));
	    if (home_dir == NULL) {
		fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
        } else {
            struct passwd *pw = getpwuid(getuid());
            if(pw) {
		free (home_dir);
		home_dir = strdup(pw->pw_dir);
		if (home_dir == NULL) {
		    fprintf(stderr, "Out of memory!\n");
		    return EXIT_FAILURE;
		}
	    }
        }
    else
        change_root_dir(&home_dir);

    if (getenv("XDG_CONFIG_HOME") == NULL) {
        /* if no XDG_CONFIG_HOME is specified take ~/.config as default */
        if (asprintf(&xdg_config_dir, "%s/.config", home_dir) < 0) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
        }
    } else {
        xdg_config_dir = strdup(getenv("XDG_CONFIG_HOME"));
	if (xdg_config_dir == NULL) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
        }
    }

    free(home_dir);

    /* Change Root dirs */
    change_root_dir(&root_dir);
    change_root_dir(&usr_root_dir);

    int ret = 0;
    if (strcmp(argv[optind], "show") == 0) {
      ret = econf_read(&key_file, delimiters, comment, true);
    } else if (strcmp(argv[optind], "syntax") == 0) {
      ret = econf_read(&key_file, delimiters, comment, false);
    } else if (strcmp(argv[optind], "edit") == 0) {
        if (!is_root || use_homedir) {
            /* adjust path to home directory of the user.*/
            free(conf_dir);
	    conf_dir = strdup(xdg_config_dir);
	    if (conf_dir == NULL) {
	        fprintf(stderr, "Out of memory!\n");
		exit(EXIT_FAILURE);
	    }
            change_root_dir(&conf_dir);
	    free(conf_path);
	    if (asprintf(&conf_path, "%s/%s", conf_dir, conf_filename) < 0) {
		fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
        } else if(is_dropin_file) {
	    free(conf_filename);
	    conf_filename = strdup(dropin_filename);
	    if (conf_filename == NULL) {
	        fprintf(stderr, "Out of memory!\n");
		exit(EXIT_FAILURE);
	    }
	    free(conf_path);
	    if (asprintf(&conf_path, "%s/%s", conf_dir, conf_filename) < 0) {
		fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
	}

        ret = econf_edit(&key_file, delimiters, comment);
    } else if (strcmp(argv[optind], "revert") == 0) {
      ret = econf_revert(is_root, use_homedir);
    } else if (strcmp(argv[optind], "cat") == 0) {
	ret = econf_cat(delimiters, comment);
    } else {
        fprintf(stderr, "Unknown command!\n\n");
        usage();
        exit(EXIT_FAILURE);
    }

    /* cleanup */
    econf_free(key_file);
    return ret;
}